

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::anon_unknown_32::FailureTest::TestBody(FailureTest *this)

{
  Message *message;
  char *file;
  ostream *this_00;
  AssertHelper local_30 [3];
  Message local_18;
  FailureTest *local_10;
  FailureTest *this_local;
  
  local_10 = this;
  if ((this->as_error_ & 1U) == 0) {
    this_00 = std::operator<<((ostream *)&std::cout,(string *)&this->error_message_);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  else {
    Message::Message(&local_18);
    message = Message::operator<<(&local_18,&this->error_message_);
    file = (char *)std::__cxx11::string::c_str();
    AssertHelper::AssertHelper(local_30,kNonFatalFailure,file,(this->loc_).line,"");
    AssertHelper::operator=(local_30,message);
    AssertHelper::~AssertHelper(local_30);
    Message::~Message(&local_18);
  }
  return;
}

Assistant:

void TestBody() override {
    if (as_error_) {
      AssertHelper(TestPartResult::kNonFatalFailure, loc_.file.c_str(),
                   loc_.line, "") = Message() << error_message_;
    } else {
      std::cout << error_message_ << std::endl;
    }
  }